

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalAvg
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  byte bVar1;
  reference this_00;
  pointer pEVar2;
  reference this_01;
  LogicalType decimal_type;
  double local_150;
  AggregateFunction local_148;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&decimal_type,&pEVar2->return_type);
  GetAverageAggregate(&local_148,decimal_type.physical_type_);
  AggregateFunction::operator=(function,&local_148);
  AggregateFunction::~AggregateFunction(&local_148);
  ::std::__cxx11::string::assign
            ((char *)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name)
  ;
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  LogicalType::operator=(this_01,&decimal_type);
  LogicalType::LogicalType((LogicalType *)&local_148,DOUBLE);
  LogicalType::operator=
            (&(function->super_BaseScalarFunction).return_type,(LogicalType *)&local_148);
  LogicalType::~LogicalType((LogicalType *)&local_148);
  bVar1 = DecimalType::GetScale(&decimal_type);
  local_150 = Hugeint::Cast<double>(*(hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar1 * 0x10));
  make_uniq<duckdb::AverageDecimalBindData,double>((duckdb *)&local_148,&local_150);
  *(_func_int ***)this =
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  LogicalType::~LogicalType(&decimal_type);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalAvg(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	function = GetAverageAggregate(decimal_type.InternalType());
	function.name = "avg";
	function.arguments[0] = decimal_type;
	function.return_type = LogicalType::DOUBLE;
	return make_uniq<AverageDecimalBindData>(
	    Hugeint::Cast<double>(Hugeint::POWERS_OF_TEN[DecimalType::GetScale(decimal_type)]));
}